

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int float32_lt_quiet_mips(float32 a,float32 b,float_status *status)

{
  bool bVar1;
  byte bVar2;
  float32 a_;
  float32 a__00;
  int iVar3;
  bool bVar4;
  
  a_ = float32_squash_input_denormal_mips(a,status);
  a__00 = float32_squash_input_denormal_mips(b,status);
  if (((~a_ & 0x7f800000) != 0 || (a_ & 0x7fffff) == 0) &&
     ((a__00 & 0x7fffff) == 0 || (~a__00 & 0x7f800000) != 0)) {
    if ((int)(a__00 ^ a_) < 0) {
      bVar4 = ((a__00 | a_) & 0x7fffffff) != 0;
      bVar1 = (int)a_ < 0;
    }
    else {
      bVar4 = a_ != a__00;
      bVar1 = (int)a_ < 0 != a_ < a__00;
    }
    bVar2 = bVar1 & bVar4;
    goto LAB_006982c1;
  }
  iVar3 = float32_is_signaling_nan_mips(a_,status);
  if (iVar3 == 0) {
    iVar3 = float32_is_signaling_nan_mips(a__00,status);
    if (iVar3 != 0) goto LAB_006982a5;
  }
  else {
LAB_006982a5:
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  bVar2 = 0;
LAB_006982c1:
  return (int)bVar2;
}

Assistant:

int float32_lt_quiet(float32 a, float32 b, float_status *status)
{
    flag aSign, bSign;
    uint32_t av, bv;
    a = float32_squash_input_denormal(a, status);
    b = float32_squash_input_denormal(b, status);

    if (    ( ( extractFloat32Exp( a ) == 0xFF ) && extractFloat32Frac( a ) )
         || ( ( extractFloat32Exp( b ) == 0xFF ) && extractFloat32Frac( b ) )
       ) {
        if (float32_is_signaling_nan(a, status)
         || float32_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 0;
    }
    aSign = extractFloat32Sign( a );
    bSign = extractFloat32Sign( b );
    av = float32_val(a);
    bv = float32_val(b);
    if ( aSign != bSign ) return aSign && ( (uint32_t) ( ( av | bv )<<1 ) != 0 );
    return ( av != bv ) && ( aSign ^ ( av < bv ) );

}